

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O0

lys_node *
read_yin_choice(lys_module *module,lys_node *parent,lyxml_elem *yin,int options,unres_schema *unres)

{
  ly_ctx *ctx_00;
  lyxml_elem *plVar1;
  bool bVar2;
  int iVar3;
  lys_module *child;
  lys_module *module_00;
  lys_node *plVar4;
  char *pcVar5;
  lys_include *plVar6;
  lys_iffeature *plVar7;
  lys_ext_instance **pplVar8;
  uint local_b4;
  void *reallocated;
  int ret;
  int c_ext;
  int c_ftrs;
  int f_mand;
  char *value;
  lys_node_choice *choice;
  lys_node *node;
  lys_node *retval;
  ly_ctx *ctx;
  lyxml_elem *dflt;
  lyxml_elem *next;
  lyxml_elem *sub;
  unres_schema *unres_local;
  int options_local;
  lyxml_elem *yin_local;
  lys_node *parent_local;
  lys_module *module_local;
  
  ctx = (ly_ctx *)0x0;
  ctx_00 = module->ctx;
  bVar2 = false;
  ret = 0;
  reallocated._4_4_ = 0;
  child = (lys_module *)calloc(1,0x78);
  if (child == (lys_module *)0x0) {
    ly_log(ctx_00,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","read_yin_choice");
    return (lys_node *)(lys_module *)0x0;
  }
  *(LYS_NODE *)&child->filepath = LYS_CHOICE;
  child->rev = (lys_revision *)child;
  if ((options & 2U) == 0) {
    local_b4 = 6;
    if ((options & 1U) != 0) {
      local_b4 = 2;
    }
  }
  else {
    local_b4 = 8;
  }
  iVar3 = read_yin_common(module,parent,child,LYEXT_PAR_NODE,yin,local_b4 | 0x11,unres);
  if (iVar3 != 0) goto LAB_0014c9b8;
  ly_log_dbg(4,"parsing %s statement \"%s\"",yin->name,child->ctx);
  module_00 = lys_main_module(module);
  iVar3 = lys_node_addchild(parent,module_00,(lys_node *)child,options);
  if (iVar3 != 0) goto LAB_0014c9b8;
  next = yin->child;
LAB_0014c049:
  if (next == (lyxml_elem *)0x0) goto LAB_0014c674;
  plVar1 = next->next;
  iVar3 = strcmp(next->ns->value,"urn:ietf:params:xml:ns:yang:yin:1");
  if (iVar3 != 0) {
    if (reallocated._4_4_ == 0xff) {
      ly_log(ctx_00,LY_LLERR,LY_EINT,"Reached limit (%lu) for storing %s in %s statement.",0xff,
             "extensions","choice");
      goto LAB_0014c9b8;
    }
    reallocated._4_4_ = reallocated._4_4_ + 1;
    next = plVar1;
    goto LAB_0014c049;
  }
  iVar3 = strcmp(next->name,"container");
  if (iVar3 == 0) {
    plVar4 = read_yin_container(module,(lys_node *)child,next,options,unres);
  }
  else {
    iVar3 = strcmp(next->name,"leaf-list");
    if (iVar3 == 0) {
      plVar4 = read_yin_leaflist(module,(lys_node *)child,next,options,unres);
      goto joined_r0x0014c287;
    }
    iVar3 = strcmp(next->name,"leaf");
    if (iVar3 == 0) {
      plVar4 = read_yin_leaf(module,(lys_node *)child,next,options,unres);
      goto joined_r0x0014c287;
    }
    iVar3 = strcmp(next->name,"list");
    if (iVar3 == 0) {
      plVar4 = read_yin_list(module,(lys_node *)child,next,options,unres);
      goto joined_r0x0014c287;
    }
    iVar3 = strcmp(next->name,"case");
    if (iVar3 == 0) {
      plVar4 = read_yin_case(module,(lys_node *)child,next,options,unres);
      goto joined_r0x0014c287;
    }
    iVar3 = strcmp(next->name,"anyxml");
    if (iVar3 == 0) {
      plVar4 = read_yin_anydata(module,(lys_node *)child,next,LYS_ANYXML,options,unres);
      goto joined_r0x0014c287;
    }
    iVar3 = strcmp(next->name,"anydata");
    if (iVar3 == 0) {
      plVar4 = read_yin_anydata(module,(lys_node *)child,next,LYS_ANYDATA,options,unres);
      goto joined_r0x0014c287;
    }
    iVar3 = strcmp(next->name,"default");
    if (iVar3 == 0) {
      if (ctx != (ly_ctx *)0x0) {
        ly_vlog(ctx_00,LYE_TOOMANY,LY_VLOG_LYS,child,next->name,yin->name);
        goto LAB_0014c9b8;
      }
      iVar3 = lyp_yin_parse_subnode_ext
                        (module,child,LYEXT_PAR_NODE,next,LYEXT_SUBSTMT_DEFAULT,'\0',unres);
      if (iVar3 != 0) goto LAB_0014c9b8;
      ctx = (ly_ctx *)next;
      lyxml_unlink_elem(ctx_00,next,0);
      next = plVar1;
      goto LAB_0014c049;
    }
    iVar3 = strcmp(next->name,"mandatory");
    if (iVar3 == 0) {
      if (bVar2) {
        ly_vlog(ctx_00,LYE_TOOMANY,LY_VLOG_LYS,child,next->name,yin->name);
        goto LAB_0014c9b8;
      }
      bVar2 = true;
      pcVar5 = lyxml_get_attr(next,"value",(char *)0x0);
      if (pcVar5 == (char *)0x0) {
        ly_vlog(ctx_00,LYE_MISSARG,LY_VLOG_NONE,(void *)0x0,"value",next->name);
        goto LAB_0014c9b8;
      }
      iVar3 = strcmp(pcVar5,"true");
      if (iVar3 == 0) {
        *(ushort *)&child->dsc = *(ushort *)&child->dsc | 0x40;
      }
      else {
        iVar3 = strcmp(pcVar5,"false");
        if (iVar3 != 0) {
          ly_vlog(ctx_00,LYE_INARG,LY_VLOG_LYS,child,pcVar5,next->name);
          goto LAB_0014c9b8;
        }
        *(ushort *)&child->dsc = *(ushort *)&child->dsc | 0x80;
      }
      iVar3 = lyp_yin_parse_subnode_ext
                        (module,child,LYEXT_PAR_NODE,next,LYEXT_SUBSTMT_MANDATORY,'\0',unres);
      if (iVar3 != 0) goto LAB_0014c9b8;
      goto LAB_0014c650;
    }
    iVar3 = strcmp(next->name,"when");
    if (iVar3 != 0) {
      iVar3 = strcmp(next->name,"if-feature");
      if (iVar3 != 0) {
        if ((1 < ((byte)(*(ushort *)&module->field_0x40 >> 1) & 7)) &&
           (iVar3 = strcmp(next->name,"choice"), iVar3 == 0)) {
          plVar4 = read_yin_choice(module,(lys_node *)child,next,options,unres);
          goto joined_r0x0014c287;
        }
        ly_vlog(ctx_00,LYE_INSTMT,LY_VLOG_LYS,child,next->name);
        goto LAB_0014c9b8;
      }
      if (ret == 0xff) {
        ly_log(ctx_00,LY_LLERR,LY_EINT,"Reached limit (%lu) for storing %s in %s statement.",0xff,
               "if-features","choice");
        goto LAB_0014c9b8;
      }
      ret = ret + 1;
      next = plVar1;
      goto LAB_0014c049;
    }
    if (child->inc != (lys_include *)0x0) {
      ly_vlog(ctx_00,LYE_TOOMANY,LY_VLOG_LYS,child,next->name,yin->name);
      goto LAB_0014c9b8;
    }
    plVar6 = (lys_include *)read_yin_when(module,next,unres);
    child->inc = plVar6;
    plVar4 = (lys_node *)child->inc;
  }
joined_r0x0014c287:
  if (plVar4 == (lys_node *)0x0) goto LAB_0014c9b8;
LAB_0014c650:
  lyxml_free(ctx_00,next);
  next = plVar1;
  goto LAB_0014c049;
LAB_0014c674:
  if (ret != 0) {
    plVar7 = (lys_iffeature *)calloc((long)ret,0x20);
    child->org = (char *)plVar7;
    if ((lys_iffeature *)child->org == (lys_iffeature *)0x0) {
      ly_log(ctx_00,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","read_yin_choice");
      goto LAB_0014c9b8;
    }
  }
  if (reallocated._4_4_ != 0) {
    pplVar8 = (lys_ext_instance **)
              realloc(child->ref,
                      (long)(int)(reallocated._4_4_ + (uint)*(uint8_t *)((long)&child->dsc + 2)) <<
                      3);
    if (pplVar8 == (lys_ext_instance **)0x0) {
      ly_log(ctx_00,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","read_yin_choice");
      goto LAB_0014c9b8;
    }
    child->ref = (char *)pplVar8;
    memset((lys_ext_instance **)((long)child->ref + (ulong)*(uint8_t *)((long)&child->dsc + 2) * 8),
           0,(long)reallocated._4_4_ << 3);
  }
  next = yin->child;
  do {
    while( true ) {
      if (next == (lyxml_elem *)0x0) {
        if ((ctx != (ly_ctx *)0x0) && (((ulong)child->dsc & 0x40) != 0)) {
          ly_vlog(ctx_00,LYE_INCHILDSTMT,LY_VLOG_LYS,child,"default","choice");
          ly_vlog(ctx_00,LYE_SPEC,LY_VLOG_PREV,(void *)0x0,
                  "The \"default\" statement is forbidden on choices with \"mandatory\".");
          goto LAB_0014c9b8;
        }
        if (ctx != (ly_ctx *)0x0) {
          pcVar5 = lyxml_get_attr((lyxml_elem *)ctx,"value",(char *)0x0);
          if (pcVar5 == (char *)0x0) {
            ly_vlog(ctx_00,LYE_MISSARG,LY_VLOG_NONE,(void *)0x0,"value",(ctx->models).search_paths);
            goto LAB_0014c9b8;
          }
          iVar3 = unres_schema_add_str(module,unres,child,UNRES_CHOICE_DFLT,pcVar5);
          if (iVar3 == -1) goto LAB_0014c9b8;
          lyxml_free(ctx_00,(lyxml_elem *)ctx);
        }
        if (((ctx_00->models).flags & 2U) != 0) {
          return (lys_node *)child;
        }
        if (child->inc == (lys_include *)0x0) {
          return (lys_node *)child;
        }
        if ((options & 4U) == 0) {
          iVar3 = unres_schema_add_node(module,unres,child,UNRES_XPATH,(lys_node *)0x0);
          if (iVar3 != -1) {
            return (lys_node *)child;
          }
        }
        else {
          iVar3 = lyxp_node_check_syntax((lys_node *)child);
          if (iVar3 == 0) {
            return (lys_node *)child;
          }
        }
        goto LAB_0014c9b8;
      }
      plVar1 = next->next;
      iVar3 = strcmp(next->ns->value,"urn:ietf:params:xml:ns:yang:yin:1");
      if (iVar3 == 0) break;
      iVar3 = lyp_yin_fill_ext(child,LYEXT_PAR_NODE,LYEXT_SUBSTMT_SELF,'\0',module,next,
                               (lys_ext_instance ***)&child->ref,*(uint8_t *)((long)&child->dsc + 2)
                               ,unres);
      *(uint8_t *)((long)&child->dsc + 2) = *(uint8_t *)((long)&child->dsc + 2) + '\x01';
      next = plVar1;
      if (iVar3 != 0) goto LAB_0014c9b8;
    }
    iVar3 = fill_yin_iffeature((lys_node *)child,0,next,
                               (lys_iffeature *)child->org + *(uint8_t *)((long)&child->dsc + 3),
                               unres);
    *(uint8_t *)((long)&child->dsc + 3) = *(uint8_t *)((long)&child->dsc + 3) + '\x01';
    next = plVar1;
  } while (iVar3 == 0);
LAB_0014c9b8:
  lyxml_free(ctx_00,(lyxml_elem *)ctx);
  lys_node_free((lys_node *)child,(_func_void_lys_node_ptr_void_ptr *)0x0,0);
  return (lys_node *)(lys_module *)0x0;
}

Assistant:

static struct lys_node *
read_yin_choice(struct lys_module *module, struct lys_node *parent, struct lyxml_elem *yin, int options,
                struct unres_schema *unres)
{
    struct lyxml_elem *sub, *next, *dflt = NULL;
    struct ly_ctx *const ctx = module->ctx;
    struct lys_node *retval, *node = NULL;
    struct lys_node_choice *choice;
    const char *value;
    int f_mand = 0, c_ftrs = 0, c_ext = 0, ret;
    void *reallocated;

    choice = calloc(1, sizeof *choice);
    LY_CHECK_ERR_RETURN(!choice, LOGMEM(ctx), NULL);

    choice->nodetype = LYS_CHOICE;
    choice->prev = (struct lys_node *)choice;
    retval = (struct lys_node *)choice;

    if (read_yin_common(module, parent, retval, LYEXT_PAR_NODE, yin,
            OPT_IDENT | OPT_MODULE | ((options & LYS_PARSE_OPT_CFG_IGNORE) ? OPT_CFG_IGNORE :
                (options & LYS_PARSE_OPT_CFG_NOINHERIT) ? OPT_CFG_PARSE : OPT_CFG_PARSE | OPT_CFG_INHERIT),
            unres)) {
        goto error;
    }

    LOGDBG(LY_LDGYIN, "parsing %s statement \"%s\"", yin->name, retval->name);

    /* insert the node into the schema tree */
    if (lys_node_addchild(parent, lys_main_module(module), retval, options)) {
        goto error;
    }

    /* process choice's specific children */
    LY_TREE_FOR_SAFE(yin->child, next, sub) {
        if (strcmp(sub->ns->value, LY_NSYIN)) {
            /* extension */
            YIN_CHECK_ARRAY_OVERFLOW_GOTO(ctx, c_ext, retval->ext_size, "extensions", "choice", error);
            c_ext++;
            /* keep it for later processing, skip lyxml_free() */
            continue;
        } else if (!strcmp(sub->name, "container")) {
            if (!(node = read_yin_container(module, retval, sub, options, unres))) {
                goto error;
            }
        } else if (!strcmp(sub->name, "leaf-list")) {
            if (!(node = read_yin_leaflist(module, retval, sub, options, unres))) {
                goto error;
            }
        } else if (!strcmp(sub->name, "leaf")) {
            if (!(node = read_yin_leaf(module, retval, sub, options, unres))) {
                goto error;
            }
        } else if (!strcmp(sub->name, "list")) {
            if (!(node = read_yin_list(module, retval, sub, options, unres))) {
                goto error;
            }
        } else if (!strcmp(sub->name, "case")) {
            if (!(node = read_yin_case(module, retval, sub, options, unres))) {
                goto error;
            }
        } else if (!strcmp(sub->name, "anyxml")) {
            if (!(node = read_yin_anydata(module, retval, sub, LYS_ANYXML, options, unres))) {
                goto error;
            }
        } else if (!strcmp(sub->name, "anydata")) {
            if (!(node = read_yin_anydata(module, retval, sub, LYS_ANYDATA, options, unres))) {
                goto error;
            }
        } else if (!strcmp(sub->name, "default")) {
            if (dflt) {
                LOGVAL(ctx, LYE_TOOMANY, LY_VLOG_LYS, retval, sub->name, yin->name);
                goto error;
            }

            if (lyp_yin_parse_subnode_ext(module, retval, LYEXT_PAR_NODE, sub, LYEXT_SUBSTMT_DEFAULT, 0, unres)) {
                goto error;
            }

            dflt = sub;
            lyxml_unlink_elem(ctx, dflt, 0);
            continue;
            /* skip lyxml_free() at the end of the loop, the sub node is processed later as dflt */

        } else if (!strcmp(sub->name, "mandatory")) {
            if (f_mand) {
                LOGVAL(ctx, LYE_TOOMANY, LY_VLOG_LYS, retval, sub->name, yin->name);
                goto error;
            }
            /* just checking the flags in leaf is not sufficient, we would allow
             * multiple mandatory statements with the "false" value
             */
            f_mand = 1;

            GETVAL(ctx, value, sub, "value");
            if (!strcmp(value, "true")) {
                choice->flags |= LYS_MAND_TRUE;
            } else if (!strcmp(value, "false")) {
                choice->flags |= LYS_MAND_FALSE;
            } else {
                LOGVAL(ctx, LYE_INARG, LY_VLOG_LYS, retval, value, sub->name);
                goto error;
            }                   /* else false is the default value, so we can ignore it */

            if (lyp_yin_parse_subnode_ext(module, retval, LYEXT_PAR_NODE, sub, LYEXT_SUBSTMT_MANDATORY, 0, unres)) {
                goto error;
            }
        } else if (!strcmp(sub->name, "when")) {
            if (choice->when) {
                LOGVAL(ctx, LYE_TOOMANY, LY_VLOG_LYS, retval, sub->name, yin->name);
                goto error;
            }

            choice->when = read_yin_when(module, sub, unres);
            if (!choice->when) {
                goto error;
            }
        } else if (!strcmp(sub->name, "if-feature")) {
            YIN_CHECK_ARRAY_OVERFLOW_GOTO(ctx, c_ftrs, retval->iffeature_size, "if-features", "choice", error);
            c_ftrs++;

            /* skip lyxml_free() at the end of the loop, the sub node is processed later */
            continue;
        } else if (module->version >= 2 && !strcmp(sub->name, "choice")) {
            if (!(node = read_yin_choice(module, retval, sub, options, unres))) {
                goto error;
            }
        } else {
            LOGVAL(ctx, LYE_INSTMT, LY_VLOG_LYS, retval, sub->name);
            goto error;
        }

        node = NULL;
        lyxml_free(ctx, sub);
    }

    if (c_ftrs) {
        choice->iffeature = calloc(c_ftrs, sizeof *choice->iffeature);
        LY_CHECK_ERR_GOTO(!choice->iffeature, LOGMEM(ctx), error);
    }
    if (c_ext) {
        /* some extensions may be already present from the substatements */
        reallocated = realloc(retval->ext, (c_ext + retval->ext_size) * sizeof *retval->ext);
        LY_CHECK_ERR_GOTO(!reallocated, LOGMEM(ctx), error);
        retval->ext = reallocated;

        /* init memory */
        memset(&retval->ext[retval->ext_size], 0, c_ext * sizeof *retval->ext);
    }

    LY_TREE_FOR_SAFE(yin->child, next, sub) {
        if (strcmp(sub->ns->value, LY_NSYIN)) {
            /* extension */
            ret = lyp_yin_fill_ext(retval, LYEXT_PAR_NODE, 0, 0, module, sub, &retval->ext, retval->ext_size, unres);
            retval->ext_size++;
            if (ret) {
                goto error;
            }
        } else {
            ret = fill_yin_iffeature(retval, 0, sub, &choice->iffeature[choice->iffeature_size], unres);
            choice->iffeature_size++;
            if (ret) {
                goto error;
            }
        }
    }

    /* check - default is prohibited in combination with mandatory */
    if (dflt && (choice->flags & LYS_MAND_TRUE)) {
        LOGVAL(ctx, LYE_INCHILDSTMT, LY_VLOG_LYS, retval, "default", "choice");
        LOGVAL(ctx, LYE_SPEC, LY_VLOG_PREV, NULL, "The \"default\" statement is forbidden on choices with \"mandatory\".");
        goto error;
    }

    /* link default with the case */
    if (dflt) {
        GETVAL(ctx, value, dflt, "value");
        if (unres_schema_add_str(module, unres, choice, UNRES_CHOICE_DFLT, value) == -1) {
            goto error;
        }
        lyxml_free(ctx, dflt);
    }

    /* check XPath dependencies */
    if (!(ctx->models.flags & LY_CTX_TRUSTED) && choice->when) {
        if (options & LYS_PARSE_OPT_INGRP) {
            if (lyxp_node_check_syntax(retval)) {
                goto error;
            }
        } else {
            if (unres_schema_add_node(module, unres, retval, UNRES_XPATH, NULL) == -1) {
                goto error;
            }
        }
    }

    return retval;

error:
    lyxml_free(ctx, dflt);
    lys_node_free(retval, NULL, 0);
    return NULL;
}